

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_binder.cpp
# Opt level: O2

void __thiscall
duckdb::CheckBinder::CheckBinder
          (CheckBinder *this,Binder *binder,ClientContext *context,string *table_p,
          ColumnList *columns,physical_index_set_t *bound_columns)

{
  LogicalType local_40;
  
  ExpressionBinder::ExpressionBinder(&this->super_ExpressionBinder,binder,context,false);
  (this->super_ExpressionBinder)._vptr_ExpressionBinder = (_func_int **)&PTR__CheckBinder_027a43f0;
  ::std::__cxx11::string::string((string *)&this->table,(string *)table_p);
  this->columns = columns;
  this->bound_columns = bound_columns;
  LogicalType::LogicalType(&local_40,INTEGER);
  LogicalType::operator=(&(this->super_ExpressionBinder).target_type,&local_40);
  LogicalType::~LogicalType(&local_40);
  return;
}

Assistant:

CheckBinder::CheckBinder(Binder &binder, ClientContext &context, string table_p, const ColumnList &columns,
                         physical_index_set_t &bound_columns)
    : ExpressionBinder(binder, context), table(std::move(table_p)), columns(columns), bound_columns(bound_columns) {
	target_type = LogicalType::INTEGER;
}